

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PrefixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  Type *args_1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  Expression *pEVar2;
  UnaryExpression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  UnaryOperator op;
  UnaryOperator local_64;
  Token *local_60;
  Expression *local_58;
  SourceRange local_50;
  SourceRange local_40;
  
  local_64 = OpInfo::getUnary((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
  bVar1 = OpInfo::isLValue(local_64);
  extraFlags.m_bits = 0x4000100000;
  if (!bVar1) {
    extraFlags.m_bits = 0;
  }
  pEVar2 = Expression::create(compilation,(syntax->operand).ptr,context,extraFlags,(Type *)0x0);
  args_1 = (pEVar2->type).ptr;
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_60 = &syntax->operatorToken;
  local_50 = parsing::Token::range(local_60);
  expr = BumpAllocator::
         emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_64,args_1,pEVar2,&local_40,&local_50);
  local_58 = pEVar2;
  bVar1 = Expression::bad(pEVar2);
  if (!bVar1) {
    syntax_00._M_ptr =
         (syntax->attributes).
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->attributes).
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    ASTContext::setAttributes(context,&expr->super_Expression,syntax_00);
    pEVar2 = (Expression *)
             (*(code *)(&DAT_004bd840 +
                       *(int *)(&DAT_004bd840 +
                               (ulong)((syntax->super_ExpressionSyntax).super_SyntaxNode.kind -
                                      UnaryBitwiseAndExpression) * 4)))();
    return pEVar2;
  }
  pEVar2 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar2;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PrefixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    auto op = OpInfo::getUnary(syntax.kind);
    bitmask<ASTFlags> extraFlags;
    if (OpInfo::isLValue(op))
        extraFlags = ASTFlags::LValue | ASTFlags::LAndRValue;

    Expression& operand = create(compilation, *syntax.operand, context, extraFlags);
    const Type* type = operand.type;

    auto result = compilation.emplace<UnaryExpression>(op, *type, operand, syntax.sourceRange(),
                                                       syntax.operatorToken.range());
    if (operand.bad())
        return badExpr(compilation, result);

    context.setAttributes(*result, syntax.attributes);

    bool good;
    switch (syntax.kind) {
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
            // Supported for both integral and real types. Result is same as input type.
            good = type->isNumeric();
            result->type = type;
            break;
        case SyntaxKind::UnaryLogicalNotExpression:
            // Supported for all boolean convertible types. Result is a single bit.
            good = type->isBooleanConvertible();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryBitwiseNotExpression:
            // Supported for integral only. Result is same as input type.
            good = type->isIntegral();
            result->type = type;
            break;
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
            // Supported for integral only. Result type is always a single bit.
            good = type->isIntegral();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            if ((context.flags.has(ASTFlags::NonProcedural) &&
                 !context.flags.has(ASTFlags::AssignmentAllowed)) ||
                context.flags.has(ASTFlags::AssignmentDisallowed)) {
                context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
                return badExpr(compilation, result);
            }

            // Supported for both integral and real types. Result is same as input type.
            // The operand must also be an assignable lvalue.
            good = type->isNumeric();
            result->type = type;
            if (!operand.requireLValue(context, syntax.operatorToken.location())) {
                return badExpr(compilation, result);
            }

            break;
        default:
            SLANG_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}